

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O0

ref<immutable::rrb_details::internal_node<int,_true>_> *
immutable::rrb_details::mutate_first_k<int,true,5>
          (ref<immutable::transient_rrb<int,_true,_5>_> *trrb,uint32_t k)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  transient_rrb<int,_true,_5> *ptVar3;
  internal_node<int,_true> *piVar4;
  internal_node<int,_true> *piVar5;
  rrb_size_table<true> *prVar6;
  leaf_node<int,_true> *plVar7;
  uint uVar8;
  ref<immutable::rrb_details::leaf_node<int,_true>_> local_58;
  ref<immutable::rrb_details::leaf_node<int,_true>_> leaf;
  ref<immutable::rrb_details::internal_node<int,_true>_> temp;
  uint32_t child_index;
  uint local_34;
  uint32_t local_30;
  uint32_t i;
  uint32_t shift;
  uint32_t index;
  ref<immutable::rrb_details::internal_node<int,_true>_> *to_set;
  ref<immutable::rrb_details::internal_node<int,_true>_> current;
  guid_type guid;
  uint32_t k_local;
  ref<immutable::transient_rrb<int,_true,_5>_> *trrb_local;
  
  current.ptr._4_4_ = k;
  ptVar3 = ref<immutable::transient_rrb<int,_true,_5>_>::operator->(trrb);
  current.ptr._0_4_ = ptVar3->guid;
  ptVar3 = ref<immutable::transient_rrb<int,_true,_5>_>::operator->(trrb);
  ref<immutable::rrb_details::internal_node<int,true>>::
  ref<immutable::rrb_details::tree_node<int,true>>
            ((ref<immutable::rrb_details::internal_node<int,true>> *)&to_set,&ptVar3->root);
  ptVar3 = ref<immutable::transient_rrb<int,_true,_5>_>::operator->(trrb);
  _shift = (ref<immutable::rrb_details::internal_node<int,true>> *)&ptVar3->root;
  ptVar3 = ref<immutable::transient_rrb<int,_true,_5>_>::operator->(trrb);
  i = ptVar3->cnt - 2;
  ptVar3 = ref<immutable::transient_rrb<int,_true,_5>_>::operator->(trrb);
  local_30 = ptVar3->shift;
  local_34 = 1;
  while (local_34 <= current.ptr._4_4_ && local_30 != 0) {
    ensure_internal_editable<int,true,5>
              ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set,
               (guid_type)current.ptr);
    ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
              ((ref<immutable::rrb_details::internal_node<int,_true>_> *)_shift,
               (ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
    if (local_34 == current.ptr._4_4_) {
      piVar4 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
      piVar4->len = piVar4->len + 1;
    }
    piVar4 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
    if ((piVar4->size_table).ptr != (rrb_size_table<true> *)0x0) {
      piVar4 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
      piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
      ensure_size_table_editable<int,true,5>(&piVar4->size_table,piVar5->len,(guid_type)current.ptr)
      ;
      if (local_34 == current.ptr._4_4_) {
        piVar4 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
        prVar6 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&piVar4->size_table)
        ;
        puVar2 = prVar6->size;
        piVar4 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
        uVar1 = puVar2[piVar4->len - 2];
        piVar4 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
        prVar6 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&piVar4->size_table)
        ;
        puVar2 = prVar6->size;
        piVar4 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
        puVar2[piVar4->len - 1] = uVar1 + 0x20;
      }
      else {
        piVar4 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
        prVar6 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&piVar4->size_table)
        ;
        puVar2 = prVar6->size;
        piVar4 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
        uVar8 = piVar4->len - 1;
        puVar2[uVar8] = puVar2[uVar8] + 0x20;
      }
    }
    piVar4 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
    if ((piVar4->size_table).ptr == (rrb_size_table<true> *)0x0) {
      temp.ptr._0_4_ = i >> ((byte)local_30 & 0x1f) & 0x1f;
    }
    else {
      piVar4 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
      uVar1 = piVar4->len;
      temp.ptr._0_4_ = uVar1 - 1;
      if ((uint)temp.ptr != 0) {
        piVar4 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
        prVar6 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&piVar4->size_table)
        ;
        i = i - prVar6->size[uVar1 - 2];
      }
    }
    piVar4 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
    _shift = (ref<immutable::rrb_details::internal_node<int,true>> *)
             (piVar4->child + (uint)temp.ptr);
    piVar4 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
    ref<immutable::rrb_details::internal_node<int,_true>_>::ref
              ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&leaf,
               piVar4->child + (uint)temp.ptr);
    ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
              ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set,
               (ref<immutable::rrb_details::internal_node<int,_true>_> *)&leaf);
    local_34 = local_34 + 1;
    local_30 = local_30 - 5;
    ref<immutable::rrb_details::internal_node<int,_true>_>::~ref
              ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&leaf);
  }
  if (local_34 == current.ptr._4_4_) {
    ref<immutable::rrb_details::leaf_node<int,true>>::
    ref<immutable::rrb_details::internal_node<int,true>>
              ((ref<immutable::rrb_details::leaf_node<int,true>> *)&local_58,
               (ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
    ensure_leaf_editable<int,true,5>(&local_58,(guid_type)current.ptr);
    plVar7 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->(&local_58);
    plVar7->len = plVar7->len + 1;
    ref<immutable::rrb_details::internal_node<int,true>>::operator=(_shift,&local_58);
    ref<immutable::rrb_details::leaf_node<int,_true>_>::~ref(&local_58);
  }
  ref<immutable::rrb_details::internal_node<int,_true>_>::~ref
            ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&to_set);
  return (ref<immutable::rrb_details::internal_node<int,_true>_> *)_shift;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>>* mutate_first_k(const ref<transient_rrb<T, atomic_ref_counting, N>>& trrb, const uint32_t k)
      {
      guid_type guid = trrb->guid;
      ref<internal_node<T, atomic_ref_counting>> current = trrb->root;
      ref<internal_node<T, atomic_ref_counting>>* to_set = (ref<internal_node<T, atomic_ref_counting>>*)&trrb->root;
      uint32_t index = trrb->cnt - 2;
      uint32_t shift = trrb->shift;

      // mutate all non-leaf nodes first. Happens when shift > RRB_BRANCHING
      uint32_t i = 1;
      while (i <= k && shift != 0)
        {
        // First off, ensure current node is editable
        ensure_internal_editable<T, atomic_ref_counting, N>(current, guid);
        *to_set = current;

        if (i == k)
          {
          // increase width of node
          current->len++;
          }

        if (current->size_table.ptr != nullptr)
          {
          // Ensure size table is editable too
          ensure_size_table_editable<T, atomic_ref_counting, N>(current->size_table, current->len, guid);
          if (i != k)
            {
            // Tail will always be 32 long, otherwise we insert a single element only
            current->size_table->size[current->len - 1] += bits<N>::rrb_branching;
            }
          else { // increment size of last element -- will only happen if we append empties
            current->size_table->size[current->len - 1] = current->size_table->size[current->len - 2] + bits<N>::rrb_branching;
            }
          }

        // calculate child index
        uint32_t child_index;
        if (current->size_table.ptr == nullptr)
          {
          child_index = (index >> shift) & bits<N>::rrb_mask;
          }
        else {
          // no need for sized_pos here, luckily.
          child_index = current->len - 1;
          // Decrement index
          if (child_index != 0)
            {
            index -= current->size_table->size[child_index - 1];
            }
          }
        to_set = &current->child[child_index];
        auto temp = current->child[child_index];
        current = temp;

        i++;
        shift -= bits<N>::rrb_bits;
        }

      // check if we need to mutate the leaf node. Very likely to happen (31/32)
      if (i == k)
        {
        ref<leaf_node<T, atomic_ref_counting>> leaf = current;
        ensure_leaf_editable<T, atomic_ref_counting, N>(leaf, guid);
        leaf->len++;
        *to_set = leaf;
        }
      return to_set;
      }